

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O2

locale __thiscall
booster::locale::impl_posix::create_parsing_impl<char>
          (impl_posix *this,locale *in,shared_ptr<__locale_struct_*> *lc)

{
  num_punct_posix<char> *this_00;
  ctype_posix<char> *this_01;
  base_num_parse<char> *__f;
  locale local_40;
  __shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2> local_38;
  
  this_00 = (num_punct_posix<char> *)operator_new(0x78);
  num_punct_posix<char>::num_punct_posix
            (this_00,*(lc->super___shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
             ,0);
  std::locale::locale<booster::locale::impl_posix::num_punct_posix<char>>((locale *)this,in,this_00)
  ;
  this_01 = (ctype_posix<char> *)operator_new(0x250);
  std::__shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_38,&lc->super___shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2>);
  ctype_posix<char>::ctype_posix(this_01,(shared_ptr<__locale_struct_*> *)&local_38);
  std::locale::locale<booster::locale::impl_posix::ctype_posix<char>>
            (&local_40,(locale *)this,this_01);
  std::locale::operator=((locale *)this,&local_40);
  std::locale::~locale(&local_40);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38._M_refcount);
  __f = (base_num_parse<char> *)operator_new(0x10);
  *(undefined4 *)&__f->field_0x8 = 0;
  *(undefined ***)__f = &PTR__facet_001dbae8;
  std::locale::locale<booster::locale::util::base_num_parse<char>>(&local_40,(locale *)this,__f);
  std::locale::operator=((locale *)this,&local_40);
  std::locale::~locale(&local_40);
  return (locale)(_Impl *)this;
}

Assistant:

std::locale create_parsing_impl(std::locale const &in,booster::shared_ptr<locale_t> lc)
{
    std::locale tmp = std::locale(in,new num_punct_posix<CharType>(*lc));
    tmp = std::locale(tmp,new ctype_posix<CharType>(lc));
    tmp = std::locale(tmp,new util::base_num_parse<CharType>());
    return tmp;
}